

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

void restore_trapset(memfile *mf,level *lev)

{
  uint id;
  undefined8 local_28;
  uint tobj_id;
  level *lev_local;
  memfile *mf_local;
  
  id = mread32(mf);
  if (id == 0) {
    local_28 = (obj *)0x0;
  }
  else {
    local_28 = find_oid(lev,id);
  }
  trapinfo.tobj = local_28;
  trapinfo.tx = mread8(mf);
  trapinfo.ty = mread8(mf);
  trapinfo.time_needed = mread32(mf);
  trapinfo.force_bungle = mread8(mf);
  return;
}

Assistant:

void restore_trapset(struct memfile *mf, struct level *lev)
{
	unsigned int tobj_id;

	tobj_id = mread32(mf);
	trapinfo.tobj = tobj_id ? find_oid(lev, tobj_id) : NULL;

	trapinfo.tx = mread8(mf);
	trapinfo.ty = mread8(mf);
	trapinfo.time_needed = mread32(mf);
	trapinfo.force_bungle = mread8(mf);
}